

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall InputStatement::Action(InputStatement *this)

{
  SymbolName SVar1;
  int line_number_00;
  undefined1 local_50 [8];
  string identifier_name;
  int character_number;
  int line_number;
  SymbolName name;
  int state;
  int ret;
  InputStatement *this_local;
  
  line_number = 0;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    line_number_00 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    identifier_name.field_2._12_4_ = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(line_number) {
    case 0:
      if (SVar1 != SCANF_SYM) {
        return -1;
      }
      line_number = 1;
      break;
    case 1:
      if (SVar1 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      line_number = 2;
      break;
    case 2:
      if (SVar1 != IDENTIFIER_SYM) {
        return -1;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 handle_correct_queue);
      IdentifierCheck((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                      line_number_00,identifier_name.field_2._12_4_);
      line_number = 3;
      std::__cxx11::string::~string((string *)local_50);
      break;
    case 3:
      if (SVar1 == COMMA_SYM) {
        line_number = 2;
      }
      else {
        if (SVar1 != R_CIRCLE_BRACKET_SYM) {
          return -1;
        }
        line_number = 4;
      }
      break;
    case 4:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode InputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == SCANF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == IDENTIFIER_SYM) {
                    string identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    IdentifierCheck(identifier_name, line_number, character_number);
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 2;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        handle_correct_queue->NextSymbol();
    }
}